

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O0

bool deqp::gles3::Functional::anon_unknown_0::compareColoredPixels(IVec4 *a,IVec4 *b)

{
  Vector<int,_4> local_58;
  Vector<int,_4> local_48;
  Vector<bool,_4> local_38;
  undefined1 local_34 [8];
  IVec4 threshold;
  bool bIsBlack;
  bool aIsBlack;
  IVec4 *b_local;
  IVec4 *a_local;
  
  unique0x100000d3 = b;
  threshold.m_data[2]._3_1_ = isBlack(a);
  threshold.m_data[2]._2_1_ = isBlack(stack0xffffffffffffffe0);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)local_34,0x14,0x14,0x14,0);
  if (((threshold.m_data[2]._3_1_ & 1) == 0) || ((threshold.m_data[2]._2_1_ & 1) == 0)) {
    if ((threshold.m_data[2]._3_1_ & 1) == (threshold.m_data[2]._2_1_ & 1)) {
      tcu::operator-((tcu *)&local_58,a,stack0xffffffffffffffe0);
      tcu::abs<int,4>((tcu *)&local_48,&local_58);
      tcu::lessThanEqual<int,4>((tcu *)&local_38,&local_48,(Vector<int,_4> *)local_34);
      a_local._7_1_ = tcu::boolAll<4>(&local_38);
    }
    else {
      a_local._7_1_ = false;
    }
  }
  else {
    a_local._7_1_ = true;
  }
  return a_local._7_1_;
}

Assistant:

inline bool compareColoredPixels (const tcu::IVec4& a, const tcu::IVec4& b)
{
	const bool aIsBlack = isBlack(a);
	const bool bIsBlack = isBlack(b);
	const tcu::IVec4 threshold(20, 20, 20, 0);

	if (aIsBlack && bIsBlack)
		return true;
	if (aIsBlack != bIsBlack)
		return false;

	return tcu::boolAll(tcu::lessThanEqual(tcu::abs(a - b), threshold));
}